

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

int __thiscall Fl_Table::row_col_clamp(Fl_Table *this,TableContext context,int *R,int *C)

{
  int iVar1;
  uint local_2c;
  int clamped;
  int *C_local;
  int *R_local;
  TableContext context_local;
  Fl_Table *this_local;
  
  iVar1 = *R;
  if (iVar1 < 0) {
    *R = 0;
  }
  local_2c = (uint)(iVar1 < 0);
  if (*C < 0) {
    *C = 0;
    local_2c = 1;
  }
  if (context == CONTEXT_ROW_HEADER) {
    if ((this->_cols <= *C) && (*C != 0)) {
      *C = this->_cols + -1;
      local_2c = 1;
    }
  }
  else if (context == CONTEXT_COL_HEADER) {
    if ((this->_rows <= *R) && (*R != 0)) {
      *R = this->_rows + -1;
      local_2c = 1;
    }
  }
  else {
    if (this->_rows <= *R) {
      *R = this->_rows + -1;
      local_2c = 1;
    }
    if (this->_cols <= *C) {
      *C = this->_cols + -1;
      local_2c = 1;
    }
  }
  return local_2c;
}

Assistant:

int Fl_Table::row_col_clamp(TableContext context, int &R, int &C) {
  int clamped = 0;
  if ( R < 0 ) { R = 0; clamped = 1; }
  if ( C < 0 ) { C = 0; clamped = 1; }
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      // Allow col headers to draw even if no rows
      if ( R >= _rows && R != 0 ) { R = _rows - 1; clamped = 1; }
      break;
      
    case CONTEXT_ROW_HEADER:
      // Allow row headers to draw even if no columns
      if ( C >= _cols && C != 0 ) { C = _cols - 1; clamped = 1; }
      break;
      
    case CONTEXT_CELL:
    default:
      // CLAMP R/C TO _rows/_cols
      if ( R >= _rows ) { R = _rows - 1; clamped = 1; }
      if ( C >= _cols ) { C = _cols - 1; clamped = 1; }
      break;
  }
  return(clamped);
}